

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::ForkBranchBase::ForkBranchBase(ForkBranchBase *this,Own<kj::_::ForkHubBase> *hubParam)

{
  ForkBranchBase **ppFVar1;
  ForkHubBase *pFVar2;
  
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_003a3808;
  (this->onReadyEvent).event = (Event *)0x0;
  pFVar2 = hubParam->ptr;
  (this->hub).disposer = hubParam->disposer;
  (this->hub).ptr = pFVar2;
  hubParam->ptr = (ForkHubBase *)0x0;
  this->next = (ForkBranchBase *)0x0;
  this->prevPtr = (ForkBranchBase **)0x0;
  ppFVar1 = ((this->hub).ptr)->tailBranch;
  if (ppFVar1 == (ForkBranchBase **)0x0) {
    PromiseNode::OnReadyEvent::arm(&this->onReadyEvent);
  }
  else {
    this->prevPtr = ppFVar1;
    *ppFVar1 = this;
    this->next = (ForkBranchBase *)0x0;
    ((this->hub).ptr)->tailBranch = &this->next;
  }
  return;
}

Assistant:

ForkBranchBase::ForkBranchBase(Own<ForkHubBase>&& hubParam): hub(kj::mv(hubParam)) {
  if (hub->tailBranch == nullptr) {
    onReadyEvent.arm();
  } else {
    // Insert into hub's linked list of branches.
    prevPtr = hub->tailBranch;
    *prevPtr = this;
    next = nullptr;
    hub->tailBranch = &next;
  }
}